

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O3

void slab_assert(slab_cache *cache,slab *slab)

{
  byte bVar1;
  undefined1 uVar2;
  pthread_t __thread1;
  int iVar3;
  pthread_t __thread2;
  size_t sVar4;
  
  __thread1 = cache->thread_id;
  __thread2 = pthread_self();
  iVar3 = pthread_equal(__thread1,__thread2);
  if (iVar3 == 0) {
    __assert_fail("pthread_equal(cache->thread_id, pthread_self())",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x42,"void slab_assert(struct slab_cache *, struct slab *)");
  }
  if (slab->magic != 0xeec0ffee) {
    __assert_fail("slab->magic == slab_magic",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x43,"void slab_assert(struct slab_cache *, struct slab *)");
  }
  bVar1 = slab->order;
  if (cache->order_max + 1 < (uint)bVar1) {
    __assert_fail("slab->order <= cache->order_max + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x44,"void slab_assert(struct slab_cache *, struct slab *)");
  }
  if (bVar1 <= cache->order_max) {
    uVar2 = cache->order0_size_lb;
    sVar4 = 1L << (bVar1 + uVar2 & 0x3f);
    if (slab->size != sVar4) {
      __assert_fail("slab->size == size",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x48,"void slab_assert(struct slab_cache *, struct slab *)");
    }
    if ((sVar4 - 1 & (ulong)slab) != 0) {
      __assert_fail("addr == (intptr_t) (addr & ~(size - 1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x4b,"void slab_assert(struct slab_cache *, struct slab *)");
    }
  }
  return;
}

Assistant:

static inline void
slab_assert(struct slab_cache *cache, struct slab *slab)
{
	(void) slab;
	assert(pthread_equal(cache->thread_id, pthread_self()));
	assert(slab->magic == slab_magic);
	assert(slab->order <= cache->order_max + 1);
	if (slab->order <= cache->order_max) {
		size_t size = slab_order_size(cache, slab->order);
		(void) size;
		assert(slab->size == size);
		intptr_t addr = (intptr_t) slab;
		(void) addr;
		assert(addr == (intptr_t) (addr & ~(size - 1)));
	}
}